

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_verification.c
# Opt level: O0

aspa_hop_result aspa_check_hop(aspa_table *aspa_table,uint32_t customer_asn,uint32_t provider_asn)

{
  long lVar1;
  byte bVar2;
  aspa_record *paVar3;
  void *pvVar4;
  long in_FS_OFFSET;
  uint32_t *provider;
  aspa_record *aspa_record;
  aspa_store_node *node;
  _Bool customer_found;
  uint32_t provider_asn_local;
  uint32_t customer_asn_local;
  aspa_table *aspa_table_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = 0;
  aspa_record = (aspa_record *)aspa_table->store;
  do {
    if (aspa_record == (aspa_record *)0x0) {
      aspa_table_local._4_4_ = (aspa_hop_result)bVar2;
LAB_00114835:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return aspa_table_local._4_4_;
      }
      __stack_chk_fail();
    }
    paVar3 = aspa_array_search(*(aspa_array **)aspa_record,customer_asn);
    if (paVar3 != (aspa_record *)0x0) {
      bVar2 = 1;
      pvVar4 = binary_search_asns(provider_asn,paVar3->provider_asns,paVar3->provider_count);
      if (pvVar4 != (void *)0x0) {
        aspa_table_local._4_4_ = ASPA_PROVIDER_PLUS;
        goto LAB_00114835;
      }
    }
    aspa_record = (aspa_record *)aspa_record->provider_asns;
  } while( true );
}

Assistant:

enum aspa_hop_result aspa_check_hop(struct aspa_table *aspa_table, uint32_t customer_asn, uint32_t provider_asn)
{
	bool customer_found = false;

	for (struct aspa_store_node *node = aspa_table->store; node != NULL; node = node->next) {
		struct aspa_record *aspa_record = aspa_array_search(node->aspa_array, customer_asn);

		if (!aspa_record)
			continue;

		customer_found = true;

		// Provider ASNs are sorted in ascending order.
		// We consider this an implementation detail, callers must not make any assumptions on the
		// ordering of provider ASNs.
		uint32_t *provider =
			binary_search_asns(provider_asn, aspa_record->provider_asns, aspa_record->provider_count);

		if (provider)
			return ASPA_PROVIDER_PLUS;
	}

	return customer_found ? ASPA_NOT_PROVIDER_PLUS : ASPA_NO_ATTESTATION;
}